

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_3,_4> * __thiscall
gl4cts::Math::transpose<double,4,3>
          (Matrix<double,_3,_4> *__return_storage_ptr__,Math *this,Matrix<double,_4,_3> *matrix)

{
  Matrix<double,_3,_4> *pMVar1;
  int row_1;
  long lVar2;
  double *pdVar3;
  Matrix<double,_3,_4> *result;
  int row;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  pMVar1 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  lVar4 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3ff00000;
      if (lVar2 != lVar5) {
        uVar6 = 0;
      }
      *(ulong *)((long)pdVar3 + lVar5) = (ulong)uVar6 << 0x20;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x60);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + 0x18;
  } while (lVar4 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<double,_3>,_4> *)
              ((Vector<double,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data + lVar4) =
           *(undefined8 *)(this + lVar4 * 4);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    lVar2 = lVar2 + 1;
    __return_storage_ptr__ = (Matrix<double,_3,_4> *)((long)__return_storage_ptr__ + 0x18);
    this = this + 8;
  } while (lVar2 != 4);
  return pMVar1;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}